

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

int rbcholu(double *A,int N,int stride,double *UB,double *UT)

{
  int iVar1;
  void *__s;
  void *__dest;
  double *A_00;
  double *B;
  double *pdVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  int iVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  uint m;
  double dVar10;
  
  if (N < 0x41) {
    iVar1 = rcholu(A,N,stride,UB);
  }
  else {
    m = N - 0x40;
    uVar9 = (ulong)m;
    __s = malloc(0x200);
    __dest = malloc(0x200);
    A_00 = (double *)malloc(uVar9 << 9);
    B = (double *)malloc(uVar9 << 9);
    rcholu(A,0x40,stride,UB);
    lVar3 = 0;
    pdVar5 = A;
    pdVar2 = UT;
    do {
      uVar8 = 0;
      pdVar7 = pdVar2;
      do {
        *pdVar7 = pdVar5[uVar8];
        uVar8 = uVar8 + 1;
        pdVar7 = pdVar7 + 0x40;
      } while ((uint)N != uVar8);
      lVar3 = lVar3 + 1;
      pdVar2 = pdVar2 + 1;
      pdVar5 = pdVar5 + stride;
    } while (lVar3 != 0x40);
    pdVar5 = A + 0x40;
    uVar8 = 0;
    do {
      memset(__s,0,0x200);
      memcpy(__dest,UT + uVar8 * 0x40 + 0x1000,0x200);
      lVar3 = 0;
      pdVar2 = UT;
      do {
        dVar10 = 0.0;
        if (lVar3 != 0) {
          lVar4 = 0;
          do {
            dVar10 = dVar10 + pdVar2[lVar4] * *(double *)((long)__s + lVar4 * 8);
            lVar4 = lVar4 + 1;
          } while (lVar3 != lVar4);
        }
        *(double *)((long)__s + lVar3 * 8) =
             (*(double *)((long)__dest + lVar3 * 8) - dVar10) / UT[lVar3 * 0x41];
        lVar3 = lVar3 + 1;
        pdVar2 = pdVar2 + 0x40;
      } while (lVar3 != 0x40);
      memcpy(A_00 + uVar8 * 0x40,__s,0x200);
      lVar3 = 0;
      pdVar2 = pdVar5;
      do {
        *pdVar2 = *(double *)((long)__s + lVar3 * 8);
        lVar3 = lVar3 + 1;
        pdVar2 = pdVar2 + stride;
      } while (lVar3 != 0x40);
      uVar8 = uVar8 + 1;
      pdVar5 = pdVar5 + 1;
    } while (uVar8 != uVar9);
    uVar8 = 0;
    pdVar5 = B;
    do {
      lVar3 = 0;
      pdVar2 = pdVar5;
      do {
        *pdVar2 = A_00[(ulong)((uint)uVar8 & 0x3ffffff) * 0x40 + lVar3];
        lVar3 = lVar3 + 1;
        pdVar2 = pdVar2 + uVar9;
      } while (lVar3 != 0x40);
      uVar8 = uVar8 + 1;
      pdVar5 = pdVar5 + 1;
    } while (uVar8 != uVar9);
    mmult(A_00,B,UT,m,0x40,m);
    free(A_00);
    free(B);
    free(__dest);
    free(__s);
    uVar8 = 1;
    if (1 < (int)m) {
      uVar8 = uVar9;
    }
    iVar1 = stride * 0x40 + 0x40;
    uVar9 = 0;
    pdVar5 = UT;
    do {
      lVar3 = 0;
      do {
        iVar6 = iVar1 + (int)lVar3;
        A[iVar6] = A[iVar6] - pdVar5[lVar3];
        lVar4 = uVar9 + lVar3;
        lVar3 = lVar3 + 1;
      } while (lVar4 + 1 < (long)(int)m);
      uVar9 = uVar9 + 1;
      pdVar5 = pdVar5 + (long)(int)m + 1;
      iVar1 = iVar1 + stride + 1;
    } while (uVar9 != uVar8);
    iVar1 = rbcholu(A + (long)(stride * 0x40) + 0x40,m,stride,UB,UT);
  }
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int rbcholu(double *A,int N, int stride, double *UB, double *UT) {
	int bs,bb,i,j,Nb,t,k,u,v,w,sc;
	double *b,*x,*U12,*U12T;
	double sum;
	
	bs = (int) BLOCKSIZE;
	bb = bs*bs;
	
	if (N <= BLOCKSIZE) {
		sc = rcholu(A,N,stride,UB);
		if (sc == -1) {
			return -1;
		}
	} else {
		Nb = N - bs;
		x = (double*) malloc(sizeof(double) * bs);
		b = (double*) malloc(sizeof(double) * bs);
		U12T = (double*) malloc(sizeof(double) * Nb * bs);
		U12 = (double*) malloc(sizeof(double) * Nb * bs);
		rcholu(A,bs,stride,UB); // U11
		
		for (i =0; i < bs;++i) {
			t = i *stride;
			u = 0;
			for(j = 0; j < N;++j) {
				UT[u+i] = A[j+t];
				u += bs;
			}
		}
		
		for(k = 0; k < Nb;++k) {
			u = k * bs;
			for(i = 0; i < bs;++i) {
				b[i] = UT[bb+u+i];
				x[i] = 0.;
			}
			for (i = 0; i < bs;++i) {
				t = i*bs;
				sum = 0;
				for (j = 0; j < i;++j) {
					sum += UT[t+j] * x[j];
				}
				x[i] = (b[i] - sum) / UT[t+i];
			}
			v = bs + k;
			for(i = 0; i < bs;++i) {
				A[v] = x[i];
				U12T[u+i] = x[i];
				v += stride;
			}
		}
		
		mtranspose(U12T,Nb,bs,U12);
		mmult(U12T,U12,UT,Nb,bs,Nb);
		free(U12T);
		free(U12);
		free(b);
		free(x);
		for (i = 0; i < Nb; ++i) {
			u = bs * stride + bs + i * stride;
			w = i * Nb;
			for(j = i; j < Nb;j++) {
				A[j + u] -= UT[j + w];
			}
		}
		
		sc = rbcholu(A + bs * stride + bs,Nb,stride,UB,UT);
		if (sc == -1) {
			return -1;
		}
	}
	
	return sc;
}